

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CNegativeInvalidModeElements<glcts::(anonymous_namespace)::test_api::ES3>::
Run(CNegativeInvalidModeElements<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  allocator<tcu::Vector<float,_4>_> *this_00;
  GLuint GVar1;
  value_type vVar2;
  GLenum GVar3;
  int iVar4;
  int iVar5;
  uint widthTest;
  uint heightTest;
  uint widthRef;
  uint heightRef;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  long lVar9;
  DILogger local_bd8;
  allocator<tcu::Vector<float,_4>_> local_a51;
  Vector<float,_4> local_a50;
  undefined1 local_a40 [8];
  CColorArray bufferTest;
  Vector<float,_4> local_a20;
  undefined1 local_a10 [8];
  CColorArray bufferRef;
  DILogger local_878;
  DILogger local_6f8;
  DILogger local_578;
  DILogger local_3f8;
  undefined1 local_278 [8];
  DIResult result;
  size_t i;
  undefined1 local_e0 [8];
  CElementArray elements;
  DrawElementsIndirectCommand indirectElements;
  undefined1 local_a8 [8];
  CColorArray coords;
  allocator<char> local_59;
  string local_58;
  string local_38;
  CNegativeInvalidModeElements<glcts::(anonymous_namespace)::test_api::ES3> *local_18;
  CNegativeInvalidModeElements<glcts::(anonymous_namespace)::test_api::ES3> *this_local;
  
  local_18 = this;
  anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  GVar1 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,&local_38,&local_58,
                     (string *)
                     &coords.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
  this->_program = GVar1;
  std::__cxx11::string::~string
            ((string *)
             &coords.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::__cxx11::string::~string((string *)&local_38);
  if (this->_program == 0) {
    this_local = (CNegativeInvalidModeElements<glcts::(anonymous_namespace)::test_api::ES3> *)
                 &DAT_ffffffffffffffff;
  }
  else {
    glu::CallLogWrapper::glUseProgram
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->_program);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a8);
    DrawIndirectBase::PrimitiveGen
              (&this->super_DrawIndirectBase,4,8,8,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a8);
    glu::CallLogWrapper::glGenVertexArrays
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->_vao);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,this->_buffer);
    sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_a8);
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_a8,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,sVar6 << 4,pvVar7,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_a8);
    elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(1,(int)sVar6);
    sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_a8);
    i._4_4_ = 0;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&i + 3));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0,sVar6,
               (value_type_conflict4 *)((long)&i + 4),(allocator<unsigned_int> *)((long)&i + 3));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&i + 3));
    result.status_ = 0;
    while( true ) {
      lVar9 = result.status_;
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0);
      if (sVar6 <= (ulong)lVar9) break;
      vVar2 = (value_type)result.status_;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0,
                          result.status_);
      *pvVar8 = vVar2;
      result.status_ = result.status_ + 1;
    }
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,this->_bufferIndirect);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,0x14,
               &elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x88e4);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_ebo);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8893,this->_ebo);
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8893,sVar6 << 2,pvVar8,0x88e4);
    DIResult::DIResult((DIResult *)local_278);
    glu::CallLogWrapper::glDrawElementsIndirect
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x500,0x1405,(void *)0x0);
    GVar3 = glu::CallLogWrapper::glGetError
                      (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper);
    if (GVar3 != 0x500) {
      DIResult::error(&local_3f8,(DIResult *)local_278);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_3f8,
                 (char (*) [61])"Invalid error code returned by a driver for GL_FLOAT as mode");
      DILogger::~DILogger(&local_3f8);
    }
    glu::CallLogWrapper::glDrawElementsIndirect
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x1405,0x1405,(void *)0x0);
    GVar3 = glu::CallLogWrapper::glGetError
                      (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper);
    if (GVar3 != 0x500) {
      DIResult::error(&local_578,(DIResult *)local_278);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_578,
                 (char (*) [68])
                 "Invalid error code returned by a driver for GL_UNSIGNED_INT as mode");
      DILogger::~DILogger(&local_578);
    }
    glu::CallLogWrapper::glDrawElementsIndirect
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8893,0x1405,(void *)0x0);
    GVar3 = glu::CallLogWrapper::glGetError
                      (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper);
    if (GVar3 != 0x500) {
      DIResult::error(&local_6f8,(DIResult *)local_278);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_6f8,
                 (char (*) [76])
                 "Invalid error code returned by a driver for GL_ELEMENT_ARRAY_BUFFER as mode");
      DILogger::~DILogger(&local_6f8);
    }
    glu::CallLogWrapper::glDrawElementsIndirect
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x1101,0x1405,(void *)0x0);
    GVar3 = glu::CallLogWrapper::glGetError
                      (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper);
    if (GVar3 != 0x500) {
      DIResult::error(&local_878,(DIResult *)local_278);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_878,
                 (char (*) [63])"Invalid error code returned by a driver for GL_FASTEST as mode");
      DILogger::~DILogger(&local_878);
    }
    glu::CallLogWrapper::glDrawElementsIndirect
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xd05,0x1405,(void *)0x0);
    GVar3 = glu::CallLogWrapper::glGetError
                      (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper);
    if (GVar3 != 0x500) {
      DIResult::error((DILogger *)
                      &bufferRef.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(DIResult *)local_278);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)
                 &bufferRef.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (char (*) [70])
                 "Invalid error code returned by a driver for GL_PACK_ALIGNMENT as mode");
      DILogger::~DILogger((DILogger *)
                          &bufferRef.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    iVar4 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar5 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    tcu::Vector<float,_4>::Vector(&local_a20,0.0);
    this_00 = (allocator<tcu::Vector<float,_4>_> *)
              ((long)&bufferTest.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(this_00);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a10,
               (long)(iVar4 * iVar5),&local_a20,this_00);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)
               ((long)&bufferTest.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    iVar4 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar5 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    tcu::Vector<float,_4>::Vector(&local_a50,1.0);
    std::allocator<tcu::Vector<float,_4>_>::allocator(&local_a51);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a40,
               (long)(iVar4 * iVar5),&local_a50,&local_a51);
    std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_a51);
    iVar4 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar5 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_a40,0);
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
              (&this->super_DrawIndirectBase,0,0,iVar4,iVar5,pvVar7);
    widthTest = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    heightTest = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    widthRef = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    heightRef = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    lVar9 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)this,
                       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_a40,widthTest,heightTest,
                       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_a10,widthRef,heightRef);
    DIResult::sub_result(&local_bd8,(DIResult *)local_278,lVar9);
    DILogger::~DILogger(&local_bd8);
    this_local = (CNegativeInvalidModeElements<glcts::(anonymous_namespace)::test_api::ES3> *)
                 DIResult::code((DIResult *)local_278);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a40);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a10);
    DIResult::~DIResult((DIResult *)local_278);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a8);
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		_program = CreateProgram(shaders::vshSimple<api>(), "", shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		CColorArray coords;
		PrimitiveGen(GL_TRIANGLES, 8, 8, coords);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);

		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, sizeof(coords[0]) / sizeof(float), GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		DrawElementsIndirectCommand indirectElements = { 0, 0, 0, 0, 0 };
		indirectElements.count						 = static_cast<GLuint>(coords.size());
		indirectElements.primCount					 = 1;

		CElementArray elements(coords.size(), 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawElementsIndirectCommand), &indirectElements, GL_STATIC_DRAW);

		glGenBuffers(1, &_ebo);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
					 GL_STATIC_DRAW);

		DIResult result;
		glDrawElementsIndirect(GL_INVALID_ENUM, GL_UNSIGNED_INT, 0);
		if (glGetError() != GL_INVALID_ENUM)
		{
			result.error() << "Invalid error code returned by a driver for GL_FLOAT as mode";
		}

		glDrawElementsIndirect(GL_UNSIGNED_INT, GL_UNSIGNED_INT, 0);
		if (glGetError() != GL_INVALID_ENUM)
		{
			result.error() << "Invalid error code returned by a driver for GL_UNSIGNED_INT as mode";
		}

		glDrawElementsIndirect(GL_ELEMENT_ARRAY_BUFFER, GL_UNSIGNED_INT, 0);
		if (glGetError() != GL_INVALID_ENUM)
		{
			result.error() << "Invalid error code returned by a driver for GL_ELEMENT_ARRAY_BUFFER as mode";
		}

		glDrawElementsIndirect(GL_FASTEST, GL_UNSIGNED_INT, 0);
		if (glGetError() != GL_INVALID_ENUM)
		{
			result.error() << "Invalid error code returned by a driver for GL_FASTEST as mode";
		}

		glDrawElementsIndirect(GL_PACK_ALIGNMENT, GL_UNSIGNED_INT, 0);
		if (glGetError() != GL_INVALID_ENUM)
		{
			result.error() << "Invalid error code returned by a driver for GL_PACK_ALIGNMENT as mode";
		}

		CColorArray bufferRef(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.0f));
		CColorArray bufferTest(getWindowWidth() * getWindowHeight(), tcu::Vec4(1.0f));

		ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight(), &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight(), bufferRef, getWindowWidth(),
										 getWindowHeight()));

		return result.code();
	}